

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fiddle~.c
# Opt level: O1

void sigfiddle_ff(t_sigfiddle *x)

{
  if (x->x_inbuf != (t_float *)0x0) {
    freebytes(x->x_inbuf,(long)x->x_hop << 2);
    freebytes(x->x_lastanalysis,(long)x->x_hop * 8 + 0x50);
    freebytes(x->x_spiral,(long)x->x_hop << 3);
    freebytes(x->x_peakbuf,(long)x->x_npeakout << 3);
    clock_free(x->x_clock);
    return;
  }
  return;
}

Assistant:

void sigfiddle_ff(t_sigfiddle *x)               /* cleanup on free */
{
    if (x->x_inbuf)
    {
        freebytes(x->x_inbuf, sizeof(t_float) * x->x_hop);
        freebytes(x->x_lastanalysis, sizeof(t_float) * (2*x->x_hop + 4 * FILTSIZE));
        freebytes(x->x_spiral, sizeof(t_float) * 2*x->x_hop);
        freebytes(x->x_peakbuf, sizeof(*x->x_peakbuf) * x->x_npeakout);
        clock_free(x->x_clock);
    }
}